

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpi.cpp
# Opt level: O2

int __thiscall pg::FPISolver::updateBlock(FPISolver *this,int i,int n)

{
  ulong *puVar1;
  Game *pGVar2;
  bitset *pbVar3;
  uint64_t *puVar4;
  uint64_t *puVar5;
  int iVar6;
  ulong uVar7;
  ostream *poVar8;
  int *piVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  int local_44;
  _label_vertex local_40;
  
  uVar10 = (ulong)i;
  local_44 = 0;
  do {
    bVar15 = n == 0;
    n = n + -1;
    if (bVar15) {
      return local_44;
    }
    uVar14 = uVar10 >> 6;
    if ((((((this->super_Solver).disabled)->_bits[uVar14] >> (uVar10 & 0x3f) & 1) == 0) &&
        (this->frozen[uVar10] == 0)) &&
       (uVar13 = 1L << (uVar10 & 0x3f), ((this->distraction)._bits[uVar14] & uVar13) == 0)) {
      iVar6 = Solver::owner(&this->super_Solver,(int)uVar10);
      pGVar2 = (this->super_Solver).game;
      pbVar3 = (this->super_Solver).disabled;
      puVar4 = (this->distraction)._bits;
      piVar9 = pGVar2->_outedges + pGVar2->_firstouts[uVar10];
      puVar5 = (this->parity)._bits;
      if (iVar6 == 0) {
        while( true ) {
          iVar6 = *piVar9;
          uVar7 = (ulong)iVar6;
          if (uVar7 == 0xffffffffffffffff) break;
          uVar11 = uVar7 >> 6;
          if (((pbVar3->_bits[uVar11] >> (uVar7 & 0x3f) & 1) == 0) &&
             (uVar7 = 1L << (uVar7 & 0x3f),
             ((puVar5[uVar11] & uVar7) != 0) == ((puVar4[uVar11] & uVar7) != 0))) {
            uVar12 = 0;
            goto LAB_0014e364;
          }
          piVar9 = piVar9 + 1;
        }
        uVar12 = 1;
      }
      else {
        while( true ) {
          iVar6 = *piVar9;
          uVar7 = (ulong)iVar6;
          if (uVar7 == 0xffffffffffffffff) break;
          uVar11 = uVar7 >> 6;
          if (((pbVar3->_bits[uVar11] >> (uVar7 & 0x3f) & 1) == 0) &&
             (uVar7 = 1L << (uVar7 & 0x3f),
             ((puVar4[uVar11] & uVar7) != 0) != ((puVar5[uVar11] & uVar7) != 0))) {
            uVar12 = 1;
LAB_0014e364:
            this->strategy[uVar10] = iVar6;
            goto LAB_0014e36b;
          }
          piVar9 = piVar9 + 1;
        }
        uVar12 = 0;
      }
LAB_0014e36b:
      if (uVar12 != (((this->parity)._bits[uVar14] & uVar13) != 0)) {
        local_44 = local_44 + 1;
        puVar1 = (this->distraction)._bits + uVar14;
        *puVar1 = *puVar1 | uVar13;
        if (1 < (this->super_Solver).trace) {
          poVar8 = std::operator<<((this->super_Solver).logger,"vertex ");
          local_40.g = (this->super_Solver).game;
          local_40.v = (int)uVar10;
          poVar8 = operator<<(poVar8,&local_40);
          poVar8 = std::operator<<(poVar8," is now a distraction (won by ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar12);
          poVar8 = std::operator<<(poVar8,")");
          std::endl<char,std::char_traits<char>>(poVar8);
        }
      }
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

int
FPISolver::updateBlock(int i, int n)
{
    int res = 0;
    for (; n != 0; i++, n--) {
        if (disabled[i]) continue;
        if (frozen[i]) continue;
        if (distraction[i]) continue;

        // update whether current vertex <i> is a distraction by computing the one step winner
        int onestep_winner;
        if (owner(i) == 0) {
            // see if player Even can go to a vertex currently good for Even
            onestep_winner = 1;
            for (auto curedge = outs(i); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue;
                const int winner_to = parity[to] ^ distraction[to];
                if (winner_to == 0) {
                    // good for player Even
                    onestep_winner = 0;
                    // and set the strategy
                    strategy[i] = to;
                    break;
                }
            }
        } else {
            // see if player Odd can go to a vertex currently good for Odd
            onestep_winner = 0;
            for (auto curedge = outs(i); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue;
                const int winner_to = parity[to] ^ distraction[to];
                if (winner_to == 1) {
                    // good for player Odd
                    onestep_winner = 1;
                    // and set the strategy
                    strategy[i] = to;
                    break;
                }
            }
        }
        if (parity[i] != onestep_winner) {
            distraction[i] = true;
            res++;
#ifndef NDEBUG
            if (trace >= 2) logger << "vertex " << label_vertex(i) << " is now a distraction (won by " << onestep_winner << ")" << std::endl;
#endif
        }
    }
    return res;
}